

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O0

void __thiscall Util::EGM96Grav::NormCoeffs2Reg(EGM96Grav *this)

{
  Scalar *pSVar1;
  Index in_RDI;
  double dVar2;
  double dVar3;
  double Pi_lm;
  double c;
  double b;
  double a;
  double k;
  double mm;
  double ll;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *in_stack_ffffffffffffff78;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *in_stack_ffffffffffffff80;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            (in_RDI,(Index)in_stack_ffffffffffffff80);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            (in_RDI,(Index)in_stack_ffffffffffffff80);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  for (local_40 = 2.0; local_40 < 362.0; local_40 = local_40 + 1.0) {
    for (local_48 = 0.0; local_48 < local_40 + 1.0; local_48 = local_48 + 1.0) {
      local_50 = 2.0;
      if ((int)local_48 == 0) {
        local_50 = 1.0;
      }
      dVar2 = tgamma(local_40 + local_48 + 1.0);
      dVar3 = tgamma((local_40 - local_48) + 1.0);
      dVar2 = sqrt(dVar2 / (dVar3 * local_50 * (local_40 + local_40 + 1.0)));
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         (in_stack_ffffffffffffff80,(Index)in_stack_ffffffffffffff78,0x13234f);
      in_stack_ffffffffffffff78 =
           (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            *)(*pSVar1 / dVar2);
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         (in_stack_ffffffffffffff80,(Index)in_stack_ffffffffffffff78,0x13237e);
      *pSVar1 = (Scalar)in_stack_ffffffffffffff78;
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         (in_stack_ffffffffffffff80,(Index)in_stack_ffffffffffffff78,0x1323a7);
      in_stack_ffffffffffffff80 =
           (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)(*pSVar1 / dVar2);
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         (in_stack_ffffffffffffff80,(Index)in_stack_ffffffffffffff78,0x1323d7);
      *pSVar1 = (Scalar)in_stack_ffffffffffffff80;
    }
  }
  return;
}

Assistant:

void EGM96Grav::NormCoeffs2Reg(){

		//initialize matricies
		this->C_ = Eigen::MatrixXd::Zero(361,361);
		this->S_ = Eigen::MatrixXd::Zero(361,361);

		for (double ll = 2; ll < 362; ++ll) {

			for (double mm = 0; mm < ll+1; ++mm) {

				
				double k = 2.0;
				if( (int) mm == 0) {
					k = 1.0;
				}

				//intermediate values
				//Note: tgamma(i+1) = factorial(i)
				double a = tgamma(ll + mm + 1.0);
				double b = tgamma(ll - mm + 1.0);
				double c = (2.0*ll + 1.0);

				//find factor
				double Pi_lm = sqrt(a/(b*k*c));

				//update
				this->C_( (int) ll, (int) mm) = this->C_norm_( (int) ll, (int) mm)/Pi_lm;
				this->S_( (int) ll, (int) mm) = this->S_norm_( (int) ll, (int) mm)/Pi_lm;
			}
		}

	}